

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  Dec_Node_t *pDVar1;
  Dec_Graph_t *pGraph;
  Dec_Edge_t DVar2;
  void *pvVar3;
  void *pvVar4;
  Dec_Edge_t eEdge;
  Dec_Edge_t eEdge1;
  
  pvVar3 = (void *)((ulong)pObj0 & 0xfffffffffffffffe);
  pvVar4 = (void *)((ulong)pObj1 & 0xfffffffffffffffe);
  if (pvVar3 != pvVar4) {
    pGraph = Dec_GraphCreate(2);
    pDVar1 = pGraph->pNodes;
    (pDVar1->field_2).pFunc = pvVar3;
    pDVar1[1].field_2.pFunc = pvVar4;
    DVar2 = (Dec_Edge_t)(((uint)pObj0 ^ *(uint *)((long)pvVar3 + 0x14) >> 7) & 1);
    eEdge1 = (Dec_Edge_t)(((uint)pObj1 ^ *(uint *)((long)pvVar4 + 0x14) >> 7) & 1 | 2);
    if (fOrGate == 0) {
      DVar2 = Dec_GraphAddNodeAnd(pGraph,DVar2,eEdge1);
    }
    else {
      DVar2 = Dec_GraphAddNodeOr(pGraph,DVar2,eEdge1);
    }
    pGraph->eRoot = DVar2;
    if ((pRoot->field_0x14 & 0x80) != 0) {
      pGraph->eRoot = (Dec_Edge_t)((uint)DVar2 ^ 1);
    }
    return pGraph;
  }
  __assert_fail("Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                ,0x28d,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( Abc_ObjRegular(pObj0) != Abc_ObjRegular(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
    eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}